

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMatrix.cpp
# Opt level: O1

void __thiscall dgMatrix::EigenVectors(dgMatrix *this,dgVector *eigenValues,dgMatrix *initialGuess)

{
  dgTemplateVector<float> *this_00;
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  dgMatrix *this_01;
  ulong uVar10;
  uint uVar11;
  float *pfVar12;
  long lVar13;
  HaI32 i;
  ulong uVar14;
  dgTemplateVector<float> *this_02;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  dgMatrix dVar18;
  undefined1 auVar24 [48];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  HaF32 d [3];
  HaF32 z [3];
  float local_194 [3];
  undefined1 local_188 [16];
  dgMatrix *local_178;
  float local_16c;
  float local_168;
  float local_164;
  ulong local_160;
  ulong local_158;
  float local_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  dgVector *local_128;
  ulong local_120;
  dgMatrix local_118;
  dgMatrix local_d8;
  dgTemplateVector<float> local_98;
  dgTemplateVector<float> local_88;
  dgMatrix local_70;
  undefined1 auVar19 [64];
  undefined1 auVar23 [64];
  
  local_128 = eigenValues;
  Transpose4X4(&local_118,initialGuess);
  operator*(&local_d8,initialGuess,this);
  operator*(&local_70,&local_d8,&local_118);
  *this = local_70;
  local_194[0] = (this->m_front).super_dgTemplateVector<float>.m_x;
  local_194[1] = (this->m_up).super_dgTemplateVector<float>.m_y;
  local_194[2] = (this->m_right).super_dgTemplateVector<float>.m_z;
  local_d8.m_front.super_dgTemplateVector<float>.m_x = 0.0;
  local_d8.m_front.super_dgTemplateVector<float>.m_y = 0.0;
  local_d8.m_front.super_dgTemplateVector<float>.m_z = 0.0;
  local_160 = 0;
  dVar18 = local_70;
  local_178 = this;
  local_16c = local_194[2];
  local_168 = local_194[1];
  local_164 = local_194[0];
  do {
    fVar1 = (local_178->m_front).super_dgTemplateVector<float>.m_y;
    fVar15 = (local_178->m_front).super_dgTemplateVector<float>.m_z;
    auVar32._0_4_ = -fVar1;
    auVar32._4_4_ = 0x80000000;
    auVar32._8_4_ = 0x80000000;
    auVar32._12_4_ = 0x80000000;
    uVar2 = vcmpss_avx512f(auVar32,ZEXT416((uint)fVar1),2);
    bVar3 = (bool)((byte)uVar2 & 1);
    auVar19._16_48_ = dVar18._16_48_;
    auVar17._0_4_ = -fVar15;
    auVar17._4_4_ = 0x80000000;
    auVar17._8_4_ = 0x80000000;
    auVar17._12_4_ = 0x80000000;
    uVar2 = vcmpss_avx512f(auVar17,ZEXT416((uint)fVar15),2);
    bVar4 = (bool)((byte)uVar2 & 1);
    fVar16 = (local_178->m_up).super_dgTemplateVector<float>.m_z;
    auVar33._0_4_ = -fVar16;
    auVar33._4_4_ = 0x80000000;
    auVar33._8_4_ = 0x80000000;
    auVar33._12_4_ = 0x80000000;
    uVar2 = vcmpss_avx512f(auVar33,ZEXT416((uint)fVar16),2);
    bVar5 = (bool)((byte)uVar2 & 1);
    local_14c = (float)((uint)bVar3 * (int)fVar1 + (uint)!bVar3 * (int)auVar32._0_4_) +
                (float)((uint)bVar4 * (int)fVar15 + (uint)!bVar4 * (int)auVar17._0_4_) +
                (float)((uint)bVar5 * (int)fVar16 + (uint)!bVar5 * (int)auVar33._0_4_);
    if (local_14c < 1e-06) {
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(local_118.m_front.super_dgTemplateVector<float>.m_y *
                                              local_118.m_front.super_dgTemplateVector<float>.m_y)),
                                ZEXT416((uint)local_118.m_front.super_dgTemplateVector<float>.m_x),
                                ZEXT416((uint)local_118.m_front.super_dgTemplateVector<float>.m_x));
      auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)local_118.m_front.
                                                      super_dgTemplateVector<float>.m_z),
                                ZEXT416((uint)local_118.m_front.super_dgTemplateVector<float>.m_z));
      fVar1 = auVar17._0_4_ + -1.0;
      auVar30._0_4_ = -fVar1;
      auVar30._4_4_ = 0x80000000;
      auVar30._8_4_ = 0x80000000;
      auVar30._12_4_ = 0x80000000;
      uVar2 = vcmpss_avx512f(auVar30,ZEXT416((uint)fVar1),2);
      bVar3 = (bool)((byte)uVar2 & 1);
      if (1e-05 <= (float)((uint)bVar3 * (int)fVar1 + (uint)!bVar3 * (int)auVar30._0_4_)) {
        __assert_fail("dgAbsf((eigenVectors.m_front % eigenVectors.m_front) - hacd::HaF32(1.0f)) < hacd::HaF32 (1.0e-5f)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgMatrix.cpp"
                      ,0x1ef,"void dgMatrix::EigenVectors(dgVector &, const dgMatrix &)");
      }
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(local_118.m_up.super_dgTemplateVector<float>.m_y *
                                              local_118.m_up.super_dgTemplateVector<float>.m_y)),
                                ZEXT416((uint)local_118.m_up.super_dgTemplateVector<float>.m_x),
                                ZEXT416((uint)local_118.m_up.super_dgTemplateVector<float>.m_x));
      auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)local_118.m_up.super_dgTemplateVector<float>.
                                                      m_z),
                                ZEXT416((uint)local_118.m_up.super_dgTemplateVector<float>.m_z));
      fVar1 = auVar17._0_4_ + -1.0;
      auVar31._0_4_ = -fVar1;
      auVar31._4_4_ = 0x80000000;
      auVar31._8_4_ = 0x80000000;
      auVar31._12_4_ = 0x80000000;
      uVar2 = vcmpss_avx512f(auVar31,ZEXT416((uint)fVar1),2);
      bVar3 = (bool)((byte)uVar2 & 1);
      if (1e-05 <= (float)((uint)bVar3 * (int)fVar1 + (uint)!bVar3 * (int)auVar31._0_4_)) {
        __assert_fail("dgAbsf((eigenVectors.m_up % eigenVectors.m_up) - hacd::HaF32(1.0f)) < hacd::HaF32 (1.0e-5f)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgMatrix.cpp"
                      ,0x1f0,"void dgMatrix::EigenVectors(dgVector &, const dgMatrix &)");
      }
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(local_118.m_right.super_dgTemplateVector<float>.m_y *
                                              local_118.m_right.super_dgTemplateVector<float>.m_y)),
                                ZEXT416((uint)local_118.m_right.super_dgTemplateVector<float>.m_x),
                                ZEXT416((uint)local_118.m_right.super_dgTemplateVector<float>.m_x));
      auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)local_118.m_right.
                                                      super_dgTemplateVector<float>.m_z),
                                ZEXT416((uint)local_118.m_right.super_dgTemplateVector<float>.m_z));
      fVar1 = auVar17._0_4_ + -1.0;
      auVar35._0_4_ = -fVar1;
      auVar35._4_4_ = 0x80000000;
      auVar35._8_4_ = 0x80000000;
      auVar35._12_4_ = 0x80000000;
      uVar2 = vcmpss_avx512f(auVar35,ZEXT416((uint)fVar1),2);
      bVar3 = (bool)((byte)uVar2 & 1);
      if (1e-05 <= (float)((uint)bVar3 * (int)fVar1 + (uint)!bVar3 * (int)auVar35._0_4_)) {
        __assert_fail("dgAbsf((eigenVectors.m_right % eigenVectors.m_right) - hacd::HaF32(1.0f)) < hacd::HaF32 (1.0e-5f)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgMatrix.cpp"
                      ,0x1f1,"void dgMatrix::EigenVectors(dgVector &, const dgMatrix &)");
      }
      auVar17 = vfmsub231ss_fma(ZEXT416((uint)(local_118.m_up.super_dgTemplateVector<float>.m_y *
                                              local_118.m_front.super_dgTemplateVector<float>.m_z)),
                                ZEXT416((uint)local_118.m_front.super_dgTemplateVector<float>.m_y),
                                ZEXT416((uint)local_118.m_up.super_dgTemplateVector<float>.m_z));
      auVar32 = vfmsub231ss_fma(ZEXT416((uint)(local_118.m_up.super_dgTemplateVector<float>.m_z *
                                              local_118.m_front.super_dgTemplateVector<float>.m_x)),
                                ZEXT416((uint)local_118.m_up.super_dgTemplateVector<float>.m_x),
                                ZEXT416((uint)local_118.m_front.super_dgTemplateVector<float>.m_z));
      auVar33 = vfmsub231ss_fma(ZEXT416((uint)(local_118.m_up.super_dgTemplateVector<float>.m_x *
                                              local_118.m_front.super_dgTemplateVector<float>.m_y)),
                                ZEXT416((uint)local_118.m_front.super_dgTemplateVector<float>.m_x),
                                ZEXT416((uint)local_118.m_up.super_dgTemplateVector<float>.m_y));
      if ((((0x7f7fffff < (auVar17._0_4_ & 0x7fffffff)) || (0x7f7fffff < (uint)ABS(auVar32._0_4_)))
          || (0x7f7fffff < (auVar33._0_4_ & 0x7fffffff))) ||
         (0x7f7fffff < (uint)ABS(local_118.m_front.super_dgTemplateVector<float>.m_w))) {
LAB_0087a9e8:
        __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                      ,0x121,"dgVector::dgVector(const dgTemplateVector<hacd::HaF32> &)");
      }
      auVar17 = vfmadd213ss_fma(auVar17,ZEXT416((uint)local_118.m_right.
                                                      super_dgTemplateVector<float>.m_x),
                                ZEXT416((uint)(auVar32._0_4_ *
                                              local_118.m_right.super_dgTemplateVector<float>.m_y)))
      ;
      auVar17 = vfmadd213ss_fma(auVar33,ZEXT416((uint)local_118.m_right.
                                                      super_dgTemplateVector<float>.m_z),auVar17);
      if (auVar17._0_4_ < 0.0) {
        if (((0x7f7fffff < (uint)ABS(local_118.m_right.super_dgTemplateVector<float>.m_x)) ||
            (0x7f7fffff < (uint)ABS(local_118.m_right.super_dgTemplateVector<float>.m_y))) ||
           ((0x7f7fffff < (uint)ABS(local_118.m_right.super_dgTemplateVector<float>.m_z) ||
            (0x7f7fffff < (uint)ABS(local_118.m_right.super_dgTemplateVector<float>.m_w)))))
        goto LAB_0087a9e8;
        auVar34._0_4_ = -local_118.m_right.super_dgTemplateVector<float>.m_z;
        auVar34._4_4_ = 0x80000000;
        auVar34._8_4_ = 0x80000000;
        auVar34._12_4_ = 0x80000000;
        auVar17 = vinsertps_avx(auVar34,ZEXT416((uint)local_118.m_right.
                                                      super_dgTemplateVector<float>.m_w),0x1c);
        auVar32 = vinsertps_avx(ZEXT416((uint)local_118.m_right.super_dgTemplateVector<float>.m_x),
                                ZEXT416((uint)local_118.m_right.super_dgTemplateVector<float>.m_y),
                                0x1c);
        auVar25._0_8_ = auVar32._0_8_ ^ 0x8000000080000000;
        auVar25._8_4_ = auVar32._8_4_ ^ 0x80000000;
        auVar25._12_4_ = auVar32._12_4_ ^ 0x80000000;
        local_118.m_right.super_dgTemplateVector<float> =
             (dgTemplateVector<float>)vmovlhps_avx(auVar25,auVar17);
      }
      if (((NAN(local_194[2])) || (0x7f7fffff < (uint)ABS(local_194[2]))) ||
         ((NAN(local_194[1]) ||
          ((0x7f7fffff < (uint)ABS(local_194[0]) || (0x7f7fffff < (uint)ABS(local_194[1])))))))
      goto LAB_0087aa0a;
      (local_128->super_dgTemplateVector<float>).m_x = local_194[0];
      (local_128->super_dgTemplateVector<float>).m_y = local_194[1];
      (local_128->super_dgTemplateVector<float>).m_z = local_194[2];
      (local_128->super_dgTemplateVector<float>).m_w = 0.0;
      Inverse(&local_70,&local_118);
      *local_178 = local_70;
      dVar18 = local_70;
    }
    else {
      auVar19._0_16_ = ZEXT416((uint)(local_14c * 0.022222223));
      dVar18._4_60_ = auVar19._4_60_;
      dVar18.m_front.super_dgTemplateVector<float>.m_x =
           (float)((uint)((uint)local_160 < 3) * (int)(local_14c * 0.022222223));
      local_98 = (dgTemplateVector<float>)dVar18.m_front.super_dgTemplateVector<float>;
      uVar14 = 1;
      local_158 = 0;
      do {
        uVar10 = local_158;
        this_02 = &(&local_178->m_front)[local_158].super_dgTemplateVector<float>;
        local_158 = local_158 + 1;
        local_120 = uVar14;
        do {
          auVar24 = dVar18._16_48_;
          i = (HaI32)uVar14;
          pfVar12 = dgTemplateVector<float>::operator[](this_02,i);
          fVar1 = *pfVar12;
          auVar26._0_4_ = -fVar1;
          auVar26._4_4_ = 0x80000000;
          auVar26._8_4_ = 0x80000000;
          auVar26._12_4_ = 0x80000000;
          uVar2 = vcmpss_avx512f(auVar26,ZEXT416((uint)fVar1),2);
          bVar3 = (bool)((byte)uVar2 & 1);
          fVar1 = (float)((uint)bVar3 * (int)fVar1 + (uint)!bVar3 * (int)auVar26._0_4_) * 100.0;
          if ((uint)local_160 < 4) {
LAB_0087a1bb:
            local_188._0_4_ = fVar1;
            pfVar12 = dgTemplateVector<float>::operator[](this_02,i);
            fVar1 = *pfVar12;
            auVar6._8_4_ = 0x80000000;
            auVar6._0_8_ = 0x8000000080000000;
            auVar6._12_4_ = 0x80000000;
            auVar21._0_16_ = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar6);
            uVar2 = vcmpss_avx512f(auVar21._0_16_,ZEXT416((uint)fVar1),2);
            bVar3 = (bool)((byte)uVar2 & 1);
            auVar21._16_48_ = auVar24;
            dVar18._4_60_ = auVar21._4_60_;
            dVar18.m_front.super_dgTemplateVector<float>.m_x =
                 (float)((uint)bVar3 * (int)fVar1 + (uint)!bVar3 * auVar21._0_4_);
            if (local_98.m_x < dVar18.m_front.super_dgTemplateVector<float>.m_x) {
              fVar1 = local_194[uVar10];
              fVar15 = local_194[uVar14] - fVar1;
              auVar7._8_4_ = 0x80000000;
              auVar7._0_8_ = 0x8000000080000000;
              auVar7._12_4_ = 0x80000000;
              auVar17 = vxorps_avx512vl(ZEXT416((uint)fVar15),auVar7);
              uVar2 = vcmpss_avx512f(auVar17,ZEXT416((uint)fVar15),2);
              bVar3 = (bool)((byte)uVar2 & 1);
              fVar16 = (float)((uint)bVar3 * (int)fVar15 + (uint)!bVar3 * auVar17._0_4_);
              if ((fVar16 + (float)local_188._0_4_ != fVar16) ||
                 (NAN(fVar16 + (float)local_188._0_4_) || NAN(fVar16))) {
                local_188._0_4_ = fVar15 * 0.5;
                pfVar12 = dgTemplateVector<float>::operator[](this_02,i);
                local_188 = ZEXT416((uint)((float)local_188._0_4_ / *pfVar12));
                auVar17 = vfmadd213ss_fma(local_188,local_188,SUB6416(ZEXT464(0x3f800000),0));
                if (auVar17._0_4_ < 0.0) {
                  fVar15 = sqrtf(auVar17._0_4_);
                }
                else {
                  auVar17 = vsqrtss_avx(auVar17,auVar17);
                  fVar15 = auVar17._0_4_;
                }
                auVar29._0_8_ = local_188._0_8_ ^ 0x8000000080000000;
                auVar29._8_4_ = local_188._8_4_ ^ 0x80000000;
                auVar29._12_4_ = local_188._12_4_ ^ 0x80000000;
                uVar2 = vcmpss_avx512f(auVar29,local_188,2);
                bVar3 = (bool)((byte)uVar2 & 1);
                fVar15 = 1.0 / (fVar15 + (float)((uint)bVar3 * local_188._0_4_ +
                                                (uint)!bVar3 * (local_188._0_4_ ^ 0x80000000)));
                uVar2 = vcmpss_avx512f(local_188,ZEXT816(0) << 0x40,1);
                bVar3 = (bool)((byte)uVar2 & 1);
                auVar23._16_48_ = auVar24;
                auVar23._0_16_ = ZEXT416((uint)fVar15);
                auVar22._4_60_ = auVar23._4_60_;
                auVar22._0_4_ = (uint)bVar3 * (int)-fVar15 + (uint)!bVar3 * (int)fVar15;
                local_188 = auVar22._0_16_;
              }
              else {
                local_188 = ZEXT416((uint)fVar15);
                pfVar12 = dgTemplateVector<float>::operator[](this_02,i);
                local_188 = ZEXT416((uint)(*pfVar12 / (float)local_188._0_4_));
              }
              auVar17 = vfmadd213ss_fma(local_188,local_188,SUB6416(ZEXT464(0x3f800000),0));
              if (auVar17._0_4_ < 0.0) {
                fVar15 = sqrtf(auVar17._0_4_);
              }
              else {
                auVar17 = vsqrtss_avx(auVar17,auVar17);
                fVar15 = auVar17._0_4_;
              }
              pfVar12 = dgTemplateVector<float>::operator[](this_02,i);
              fVar16 = (float)local_188._0_4_ * *pfVar12;
              (&local_d8.m_front.super_dgTemplateVector<float>.m_x)[uVar10] =
                   (&local_d8.m_front.super_dgTemplateVector<float>.m_x)[uVar10] - fVar16;
              (&local_d8.m_front.super_dgTemplateVector<float>.m_x)[uVar14] =
                   fVar16 + (&local_d8.m_front.super_dgTemplateVector<float>.m_x)[uVar14];
              local_194[uVar10] = fVar1 - fVar16;
              local_194[uVar14] = fVar16 + local_194[uVar14];
              pfVar12 = dgTemplateVector<float>::operator[](this_02,i);
              this_01 = local_178;
              fVar1 = (1.0 / fVar15) * (float)local_188._0_4_;
              fVar15 = fVar1 / (1.0 / fVar15 + 1.0);
              *pfVar12 = 0.0;
              local_148 = ZEXT416((uint)fVar1);
              if (uVar10 == 1) {
                pfVar12 = dgTemplateVector<float>::operator[]
                                    ((dgTemplateVector<float> *)local_178,1);
                local_188._0_4_ = *pfVar12;
                pfVar12 = dgTemplateVector<float>::operator[]((dgTemplateVector<float> *)this_01,i);
                fVar1 = *pfVar12;
                auVar17 = vfmadd213ss_fma(ZEXT416((uint)fVar15),ZEXT416((uint)local_188._0_4_),
                                          ZEXT416((uint)fVar1));
                auVar17 = vfnmadd132ss_fma(auVar17,ZEXT416((uint)local_188._0_4_),
                                           ZEXT416((uint)local_148._0_4_));
                local_138._0_4_ = auVar17._0_4_;
                pfVar12 = dgTemplateVector<float>::operator[]((dgTemplateVector<float> *)this_01,1);
                *pfVar12 = (float)local_138._0_4_;
                auVar17 = vfnmadd231ss_fma(ZEXT416((uint)local_188._0_4_),ZEXT416((uint)fVar1),
                                           ZEXT416((uint)fVar15));
                auVar17 = vfmadd132ss_fma(auVar17,ZEXT416((uint)fVar1),
                                          ZEXT416((uint)local_148._0_4_));
                local_188._0_4_ = auVar17._0_4_;
                pfVar12 = dgTemplateVector<float>::operator[]((dgTemplateVector<float> *)this_01,i);
                *pfVar12 = (float)local_188._0_4_;
              }
              if (local_158 < uVar14) {
                auVar8._8_4_ = 0x80000000;
                auVar8._0_8_ = 0x8000000080000000;
                auVar8._12_4_ = 0x80000000;
                local_138 = vxorps_avx512vl(local_148,auVar8);
                do {
                  local_188._0_4_ = this_02->m_y;
                  pfVar12 = dgTemplateVector<float>::operator[]
                                      (&(this->m_up).super_dgTemplateVector<float>,i);
                  fVar1 = *pfVar12;
                  auVar17 = vfmadd213ss_fma(ZEXT416((uint)fVar15),ZEXT416((uint)local_188._0_4_),
                                            ZEXT416((uint)fVar1));
                  auVar17 = vfmadd132ss_fma(auVar17,ZEXT416((uint)local_188._0_4_),
                                            ZEXT416((uint)local_138._0_4_));
                  this_02->m_y = auVar17._0_4_;
                  pfVar12 = dgTemplateVector<float>::operator[]
                                      (&(this->m_up).super_dgTemplateVector<float>,i);
                  auVar17 = vfnmadd231ss_fma(ZEXT416((uint)local_188._0_4_),ZEXT416((uint)fVar1),
                                             ZEXT416((uint)fVar15));
                  auVar17 = vfmadd213ss_fma(auVar17,local_148,ZEXT416((uint)fVar1));
                  *pfVar12 = auVar17._0_4_;
                } while (2 < uVar14);
              }
              if (uVar14 != 2) {
                fVar1 = this_02->m_z;
                fVar16 = (&local_178->m_front)[uVar14].super_dgTemplateVector<float>.m_z;
                auVar17 = vfmadd213ss_fma(ZEXT416((uint)fVar15),ZEXT416((uint)fVar1),
                                          ZEXT416((uint)fVar16));
                auVar17 = vfnmadd213ss_fma(auVar17,local_148,ZEXT416((uint)fVar1));
                this_02->m_z = auVar17._0_4_;
                auVar17 = vfnmadd231ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar16),
                                           ZEXT416((uint)fVar15));
                auVar17 = vfmadd213ss_fma(auVar17,local_148,ZEXT416((uint)fVar16));
                (&local_178->m_front)[uVar14].super_dgTemplateVector<float>.m_z = auVar17._0_4_;
              }
              auVar9._8_4_ = 0x80000000;
              auVar9._0_8_ = 0x8000000080000000;
              auVar9._12_4_ = 0x80000000;
              dVar18.m_front.super_dgTemplateVector<float> =
                   (dgTemplateVector<float>)vxorps_avx512vl(local_148,auVar9);
              auVar17 = auVar24._0_16_;
              auVar32 = auVar24._16_16_;
              auVar33 = auVar24._32_16_;
              dVar18.m_up.super_dgTemplateVector<float>.m_x = (float)auVar17._0_4_;
              dVar18.m_up.super_dgTemplateVector<float>.m_y = (float)auVar17._4_4_;
              dVar18.m_up.super_dgTemplateVector<float>.m_z = (float)auVar17._8_4_;
              dVar18.m_up.super_dgTemplateVector<float>.m_w = (float)auVar17._12_4_;
              dVar18.m_right.super_dgTemplateVector<float>.m_x = (float)auVar32._0_4_;
              dVar18.m_right.super_dgTemplateVector<float>.m_y = (float)auVar32._4_4_;
              dVar18.m_right.super_dgTemplateVector<float>.m_z = (float)auVar32._8_4_;
              dVar18.m_right.super_dgTemplateVector<float>.m_w = (float)auVar32._12_4_;
              dVar18.m_posit.super_dgTemplateVector<float>.m_x = (float)auVar33._0_4_;
              dVar18.m_posit.super_dgTemplateVector<float>.m_y = (float)auVar33._4_4_;
              dVar18.m_posit.super_dgTemplateVector<float>.m_z = (float)auVar33._8_4_;
              dVar18.m_posit.super_dgTemplateVector<float>.m_w = (float)auVar33._12_4_;
              lVar13 = 0;
              local_88 = dVar18.m_front.super_dgTemplateVector<float>;
              do {
                this_00 = (dgTemplateVector<float> *)
                          ((long)&local_118.m_front.super_dgTemplateVector<float>.m_x + lVar13);
                pfVar12 = dgTemplateVector<float>::operator[](this_00,(HaI32)uVar10);
                local_188._0_4_ = *pfVar12;
                pfVar12 = dgTemplateVector<float>::operator[](this_00,i);
                fVar1 = *pfVar12;
                auVar17 = vfmadd213ss_fma(ZEXT416((uint)fVar15),ZEXT416((uint)local_188._0_4_),
                                          ZEXT416((uint)fVar1));
                auVar17 = vfmadd132ss_fma(auVar17,ZEXT416((uint)local_188._0_4_),
                                          ZEXT416((uint)local_88.m_x));
                local_138._0_4_ = auVar17._0_4_;
                pfVar12 = dgTemplateVector<float>::operator[](this_00,(HaI32)uVar10);
                *pfVar12 = (float)local_138._0_4_;
                auVar17 = vfnmadd231ss_fma(ZEXT416((uint)local_188._0_4_),ZEXT416((uint)fVar1),
                                           ZEXT416((uint)fVar15));
                auVar17 = vfmadd132ss_fma(auVar17,ZEXT416((uint)fVar1),
                                          ZEXT416((uint)local_148._0_4_));
                local_188._0_4_ = auVar17._0_4_;
                pfVar12 = dgTemplateVector<float>::operator[](this_00,i);
                *pfVar12 = (float)local_188._0_4_;
                lVar13 = lVar13 + 0x10;
              } while (lVar13 != 0x30);
            }
          }
          else {
            fVar15 = local_194[uVar10];
            auVar27._0_4_ = -fVar15;
            auVar27._4_4_ = 0x80000000;
            auVar27._8_4_ = 0x80000000;
            auVar27._12_4_ = 0x80000000;
            uVar2 = vcmpss_avx512f(auVar27,ZEXT416((uint)fVar15),2);
            bVar3 = (bool)((byte)uVar2 & 1);
            fVar15 = (float)((uint)bVar3 * (int)fVar15 + (uint)!bVar3 * (int)auVar27._0_4_);
            if ((fVar1 + fVar15 != fVar15) || (NAN(fVar1 + fVar15) || NAN(fVar15)))
            goto LAB_0087a1bb;
            fVar15 = local_194[uVar14];
            auVar28._0_4_ = -fVar15;
            auVar28._4_4_ = 0x80000000;
            auVar28._8_4_ = 0x80000000;
            auVar28._12_4_ = 0x80000000;
            uVar2 = vcmpss_avx512f(auVar28,ZEXT416((uint)fVar15),2);
            bVar3 = (bool)((byte)uVar2 & 1);
            auVar20._16_48_ = auVar24;
            auVar20._0_16_ = auVar28;
            dVar18._4_60_ = auVar20._4_60_;
            dVar18.m_front.super_dgTemplateVector<float>.m_x =
                 (float)((uint)bVar3 * (int)fVar15 + (uint)!bVar3 * (int)auVar28._0_4_);
            if ((fVar1 + dVar18.m_front.super_dgTemplateVector<float>.m_x !=
                 dVar18.m_front.super_dgTemplateVector<float>.m_x) ||
               (NAN(fVar1 + dVar18.m_front.super_dgTemplateVector<float>.m_x) ||
                NAN(dVar18.m_front.super_dgTemplateVector<float>.m_x))) goto LAB_0087a1bb;
            pfVar12 = dgTemplateVector<float>::operator[](this_02,i);
            *pfVar12 = 0.0;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != 3);
        uVar14 = local_120 + 1;
      } while (uVar10 == 0);
      local_194[0] = local_164 + local_d8.m_front.super_dgTemplateVector<float>.m_x;
      local_d8.m_front.super_dgTemplateVector<float>.m_x = 0.0;
      local_194[1] = local_168 + local_d8.m_front.super_dgTemplateVector<float>.m_y;
      local_194[2] = local_16c + local_d8.m_front.super_dgTemplateVector<float>.m_z;
      local_d8.m_front.super_dgTemplateVector<float>.m_y = 0.0;
      local_d8.m_front.super_dgTemplateVector<float>.m_z = 0.0;
      local_16c = local_194[2];
      local_168 = local_194[1];
      local_164 = local_194[0];
    }
    if (local_14c < 1e-06) {
      return;
    }
    uVar11 = (int)local_160 + 1;
    local_160 = (ulong)uVar11;
  } while (uVar11 != 0x32);
  if ((((!NAN(local_194[2])) && ((uint)ABS(local_194[2]) < 0x7f800000)) && (!NAN(local_194[1]))) &&
     (((uint)ABS(local_194[0]) < 0x7f800000 && ((uint)ABS(local_194[1]) < 0x7f800000)))) {
    (local_128->super_dgTemplateVector<float>).m_x = local_194[0];
    (local_128->super_dgTemplateVector<float>).m_y = local_194[1];
    (local_128->super_dgTemplateVector<float>).m_z = local_194[2];
    (local_128->super_dgTemplateVector<float>).m_w = 0.0;
    *local_178 = identityMatrix;
    return;
  }
LAB_0087aa0a:
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x134,"dgVector::dgVector(hacd::HaF32, hacd::HaF32, hacd::HaF32, hacd::HaF32)");
}

Assistant:

void dgMatrix::EigenVectors (dgVector &eigenValues, const dgMatrix& initialGuess)
{
	hacd::HaF32 b[3];
	hacd::HaF32 z[3];
	hacd::HaF32 d[3];

	dgMatrix& mat = *this;
	dgMatrix eigenVectors (initialGuess.Transpose4X4());
	mat = initialGuess * mat * eigenVectors;

	b[0] = mat[0][0]; 
	b[1] = mat[1][1];
	b[2] = mat[2][2];

	d[0] = mat[0][0]; 
	d[1] = mat[1][1]; 
	d[2] = mat[2][2]; 

	z[0] = hacd::HaF32 (0.0f);
	z[1] = hacd::HaF32 (0.0f);
	z[2] = hacd::HaF32 (0.0f);

	for (hacd::HaI32 i = 0; i < 50; i++) {
		hacd::HaF32 sm = dgAbsf(mat[0][1]) + dgAbsf(mat[0][2]) + dgAbsf(mat[1][2]);

		if (sm < hacd::HaF32 (1.0e-6f)) {
			HACD_ASSERT (dgAbsf((eigenVectors.m_front % eigenVectors.m_front) - hacd::HaF32(1.0f)) < dgEPSILON);
			HACD_ASSERT (dgAbsf((eigenVectors.m_up % eigenVectors.m_up) - hacd::HaF32(1.0f)) < dgEPSILON);
			HACD_ASSERT (dgAbsf((eigenVectors.m_right % eigenVectors.m_right) - hacd::HaF32(1.0f)) < dgEPSILON);

			// order the eigenvalue vectors	
			dgVector tmp (eigenVectors.m_front * eigenVectors.m_up);
			if (tmp % eigenVectors.m_right < hacd::HaF32(0.0f)) {
				eigenVectors.m_right = eigenVectors.m_right.Scale (-hacd::HaF32(1.0f));
			}

			eigenValues = dgVector (d[0], d[1], d[2], hacd::HaF32 (0.0f));
			*this = eigenVectors.Inverse();
			return;
		}

		hacd::HaF32 thresh = hacd::HaF32 (0.0f);
		if (i < 3) {
			thresh = (hacd::HaF32)(0.2f / 9.0f) * sm;
		}

		for (hacd::HaI32 ip = 0; ip < 2; ip ++) {
			for (hacd::HaI32 iq = ip + 1; iq < 3; iq ++) {
				hacd::HaF32 g = hacd::HaF32 (100.0f) * dgAbsf(mat[ip][iq]);
				//if ((i > 3) && (dgAbsf(d[0]) + g == dgAbsf(d[ip])) && (dgAbsf(d[1]) + g == dgAbsf(d[1]))) {
				if ((i > 3) && ((dgAbsf(d[ip]) + g) == dgAbsf(d[ip])) && ((dgAbsf(d[iq]) + g) == dgAbsf(d[iq]))) {
					mat[ip][iq] = hacd::HaF32 (0.0f);
				} else if (dgAbsf(mat[ip][iq]) > thresh) {

					hacd::HaF32 t;
					hacd::HaF32 h = d[iq] - d[ip];
					if (dgAbsf(h) + g == dgAbsf(h)) {
						t = mat[ip][iq] / h;
					} else {
						hacd::HaF32 theta = hacd::HaF32 (0.5f) * h / mat[ip][iq];
						t = hacd::HaF32(1.0f) / (dgAbsf(theta) + dgSqrt(hacd::HaF32(1.0f) + theta * theta));
						if (theta < hacd::HaF32 (0.0f)) {
							t = -t;
						}
					}
					hacd::HaF32 c = hacd::HaF32(1.0f) / dgSqrt (hacd::HaF32 (1.0f) + t * t); 
					hacd::HaF32 s = t * c; 
					hacd::HaF32 tau = s / (hacd::HaF32(1.0f) + c); 
					h = t * mat[ip][iq];
					z[ip] -= h; 
					z[iq] += h; 
					d[ip] -= h; 
					d[iq] += h;
					mat[ip][iq] = hacd::HaF32(0.0f);

					for (hacd::HaI32 j = 0; j <= ip - 1; j ++) {
						//ROT (mat, j, ip, j, iq, s, tau); 
						//ROT(dgMatrix &a, hacd::HaI32 i, hacd::HaI32 j, hacd::HaI32 k, hacd::HaI32 l, hacd::HaF32 s, hacd::HaF32 tau) 
						hacd::HaF32 g = mat[j][ip]; 
						hacd::HaF32 h = mat[j][iq]; 
						mat[j][ip] = g - s * (h + g * tau); 
						mat[j][iq] = h + s * (g - h * tau);

					}
					for (hacd::HaI32 j = ip + 1; j <= iq - 1; j ++) {
						//ROT (mat, ip, j, j, iq, s, tau); 
						//ROT(dgMatrix &a, hacd::HaI32 i, hacd::HaI32 j, hacd::HaI32 k, hacd::HaI32 l, hacd::HaF32 s, hacd::HaF32 tau) 
						hacd::HaF32 g = mat[ip][j]; 
						hacd::HaF32 h = mat[j][iq]; 
						mat[ip][j] = g - s * (h + g * tau); 
						mat[j][iq] = h + s * (g - h * tau);
					}
					for (hacd::HaI32 j = iq + 1; j < 3; j ++) {
						//ROT (mat, ip, j, iq, j, s, tau); 
						//ROT(dgMatrix &a, hacd::HaI32 i, hacd::HaI32 j, hacd::HaI32 k, hacd::HaI32 l, hacd::HaF32 s, hacd::HaF32 tau) 
						hacd::HaF32 g = mat[ip][j]; 
						hacd::HaF32 h = mat[iq][j]; 
						mat[ip][j] = g - s * (h + g * tau); 
						mat[iq][j] = h + s * (g - h * tau);
					}

					for (hacd::HaI32 j = 0; j < 3; j ++) {
						//ROT (eigenVectors, j, ip, j, iq, s, tau); 
						//ROT(dgMatrix &a, hacd::HaI32 i, hacd::HaI32 j, hacd::HaI32 k, hacd::HaI32 l, hacd::HaF32 s, hacd::HaF32 tau) 
						hacd::HaF32 g = eigenVectors[j][ip]; 
						hacd::HaF32 h = eigenVectors[j][iq]; 
						eigenVectors[j][ip] = g - s * (h + g * tau); 
						eigenVectors[j][iq] = h + s * (g - h * tau);
					}
				}
			}
		}
		b[0] += z[0]; d[0] = b[0]; z[0] = hacd::HaF32 (0.0f);
		b[1] += z[1]; d[1] = b[1]; z[1] = hacd::HaF32 (0.0f);
		b[2] += z[2]; d[2] = b[2]; z[2] = hacd::HaF32 (0.0f);
	}

	eigenValues = dgVector (d[0], d[1], d[2], hacd::HaF32 (0.0f));
	*this = dgGetIdentityMatrix();
}